

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv.cpp
# Opt level: O1

dxil_spv_bool
remap_srv(void *userdata,dxil_spv_d3d_binding *binding,dxil_spv_srv_vulkan_binding *vk_binding)

{
  dxil_spv_resource_kind dVar1;
  int32_t iVar2;
  uint uVar3;
  long lVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  (vk_binding->offset_binding).root_constant_index = 0;
  (vk_binding->offset_binding).bindless.heap_root_offset = 0;
  *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = 0;
  *(undefined8 *)&(vk_binding->buffer_binding).bindless.use_heap = 0;
  (vk_binding->offset_binding).set = 0;
  (vk_binding->offset_binding).binding = 0;
  (vk_binding->buffer_binding).set = 0;
  (vk_binding->buffer_binding).binding = 0;
  (vk_binding->buffer_binding).root_constant_index = 0;
  (vk_binding->buffer_binding).bindless.heap_root_offset = 0;
  iVar2 = find_root_descriptor_index((Remapper *)userdata,binding,DXIL_SPV_RESOURCE_CLASS_SRV);
  if (-1 < iVar2) {
    lVar4 = 8;
    uVar5 = 3;
    lVar7 = 0x14;
    goto LAB_0012c4d5;
  }
  uVar3 = binding->register_space;
  uVar6 = binding->register_index;
  if ((uVar6 & uVar3) == 0xffffffff) {
    bVar8 = binding->range_size == 0xffffffff;
  }
  else {
    bVar8 = false;
  }
  if (bVar8 == false) {
    if (*(char *)((long)userdata + 0x68) == '\x01') {
      (vk_binding->buffer_binding).bindless.use_heap = '\x01';
      (vk_binding->buffer_binding).bindless.heap_root_offset = uVar6;
      uVar3 = (uint)(binding->kind - DXIL_SPV_RESOURCE_KIND_TYPED_BUFFER < 3);
      (vk_binding->buffer_binding).root_constant_index = uVar3;
      goto LAB_0012c482;
    }
    (vk_binding->buffer_binding).bindless.use_heap = '\0';
  }
  else {
    (vk_binding->buffer_binding).bindless.use_heap = '\x01';
    uVar3 = 0;
LAB_0012c482:
    uVar6 = 0;
  }
  (vk_binding->buffer_binding).set = uVar3;
  (vk_binding->buffer_binding).binding = uVar6;
  dVar1 = binding->kind;
  if (((dVar1 == DXIL_SPV_RESOURCE_KIND_RT_ACCELERATION_STRUCTURE) &&
      ((bVar8 | *(byte *)((long)userdata + 0x68)) == 1)) &&
     (*(char *)((long)userdata + 0x6d) == '\x01')) {
    (vk_binding->buffer_binding).descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
  }
  iVar2 = 0;
  lVar4 = 0x1c;
  uVar5 = 0xf;
  lVar7 = 0x18;
  if ((dVar1 - DXIL_SPV_RESOURCE_KIND_RAW_BUFFER < 2) && (*(char *)((long)userdata + 0x6c) != '\0'))
  {
    (vk_binding->buffer_binding).descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
  }
LAB_0012c4d5:
  *(undefined4 *)((long)&(vk_binding->buffer_binding).set + lVar7) = uVar5;
  *(int32_t *)((long)&(vk_binding->buffer_binding).set + lVar4) = iVar2;
  return '\x01';
}

Assistant:

static dxil_spv_bool remap_srv(void *userdata, const dxil_spv_d3d_binding *binding, dxil_spv_srv_vulkan_binding *vk_binding)
{
	auto *remapper = static_cast<Remapper *>(userdata);
	*vk_binding = {};

	int32_t desc_index = find_root_descriptor_index(remapper, binding, DXIL_SPV_RESOURCE_CLASS_SRV);
	if (desc_index >= 0)
	{
		vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_BUFFER_DEVICE_ADDRESS;
		vk_binding->buffer_binding.root_constant_index = uint32_t(desc_index);
	}
	else
	{
		bool is_global_heap = d3d_binding_is_global_heap(*binding);

		if (is_global_heap)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.set = 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else if (remapper->bindless)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.bindless.heap_root_offset = binding->register_index;
			vk_binding->buffer_binding.root_constant_index = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.set = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_FALSE;
			vk_binding->buffer_binding.set = binding->register_space;
			vk_binding->buffer_binding.binding = binding->register_index;
		}

		if (binding->kind == DXIL_SPV_RESOURCE_KIND_RT_ACCELERATION_STRUCTURE)
			if ((remapper->bindless || is_global_heap) && remapper->ssbo_rtas)
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;

		if (remapper->ssbo_srv)
		{
			if (binding->kind == DXIL_SPV_RESOURCE_KIND_STRUCTURED_BUFFER ||
			    binding->kind == DXIL_SPV_RESOURCE_KIND_RAW_BUFFER)
			{
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
			}
		}

		// In case it's needed, place offset buffer here.
		vk_binding->offset_binding.set = 15;
		vk_binding->offset_binding.binding = 0;
	}

	return DXIL_SPV_TRUE;
}